

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void Merge_Sort<int>(int *a,int left,int right,_func_bool_int_int *compare)

{
  int right_00;
  
  if (left < right) {
    right_00 = (right + left) / 2;
    Merge_Sort<int>(a,left,right_00,compare);
    Merge_Sort<int>(a,right_00 + 1,right,compare);
    Merge<int>(a,left,right_00,right,compare);
    return;
  }
  return;
}

Assistant:

inline void Merge_Sort(T * a, int left, int right, bool(*compare)(T, T))
{
	int mid;
	if (left < right) {
		mid = (left + right) / 2;
		Merge_Sort(a, left, mid, compare);//nữa bên trái
		Merge_Sort(a, mid + 1, right, compare);//nữa phải
		Merge(a, left, mid, right, compare);
	}
	return;
}